

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

void __thiscall
cmCTestP4::DescribeParser::DescribeParser(DescribeParser *this,cmCTestP4 *p4,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',false);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DescribeParser_009c40f0;
  (this->RegexHeader).regmust = (char *)0x0;
  (this->RegexHeader).program = (char *)0x0;
  (this->RegexHeader).progsize = 0;
  memset(&this->RegexHeader,0,0xaa);
  (this->RegexDiff).regmust = (char *)0x0;
  (this->RegexDiff).program = (char *)0x0;
  (this->RegexDiff).progsize = 0;
  memset(&this->RegexDiff,0,0xaa);
  this->P4 = p4;
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Changes).
           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Changes).
           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->Rev).Rev._M_dataplus._M_p = (pointer)&(this->Rev).Rev.field_2;
  (this->Rev).Rev._M_string_length = 0;
  (this->Rev).Rev.field_2._M_local_buf[0] = '\0';
  (this->Rev).Date._M_dataplus._M_p = (pointer)&(this->Rev).Date.field_2;
  (this->Rev).Date._M_string_length = 0;
  (this->Rev).Date.field_2._M_local_buf[0] = '\0';
  (this->Rev).Author._M_dataplus._M_p = (pointer)&(this->Rev).Author.field_2;
  (this->Rev).Author._M_string_length = 0;
  (this->Rev).Author.field_2._M_local_buf[0] = '\0';
  (this->Rev).EMail._M_dataplus._M_p = (pointer)&(this->Rev).EMail.field_2;
  (this->Rev).EMail._M_string_length = 0;
  (this->Rev).EMail.field_2._M_local_buf[0] = '\0';
  (this->Rev).Committer._M_dataplus._M_p = (pointer)&(this->Rev).Committer.field_2;
  (this->Rev).Committer._M_string_length = 0;
  (this->Rev).Committer.field_2._M_local_buf[0] = '\0';
  (this->Rev).CommitterEMail._M_dataplus._M_p = (pointer)&(this->Rev).CommitterEMail.field_2;
  (this->Rev).CommitterEMail._M_string_length = 0;
  (this->Rev).CommitterEMail.field_2._M_local_buf[0] = '\0';
  (this->Rev).CommitDate._M_dataplus._M_p = (pointer)&(this->Rev).CommitDate.field_2;
  (this->Rev).CommitDate._M_string_length = 0;
  (this->Rev).CommitDate.field_2._M_local_buf[0] = '\0';
  (this->Rev).Log._M_dataplus._M_p = (pointer)&(this->Rev).Log.field_2;
  (this->Rev).Log._M_string_length = 0;
  (this->Rev).Log.field_2._M_local_buf[0] = '\0';
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(p4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexHeader,"^Change ([0-9]+) by (.+)@(.+) on (.*)$");
  cmsys::RegularExpression::compile(&this->RegexDiff,"^\\.\\.\\. (.*)#[0-9]+ ([^ ]+)$");
  return;
}

Assistant:

DescribeParser(cmCTestP4* p4, const char* prefix)
    : LineParser('\n', false)
    , P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexHeader.compile("^Change ([0-9]+) by (.+)@(.+) on (.*)$");
    this->RegexDiff.compile(R"(^\.\.\. (.*)#[0-9]+ ([^ ]+)$)");
  }